

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

ShaderCodeVariableDesc *
Diligent::GLDataTypeToShaderCodeVariableDesc
          (ShaderCodeVariableDesc *__return_storage_ptr__,GLenum glDataType)

{
  GLenum glDataType_local;
  
  ShaderCodeVariableDesc::ShaderCodeVariableDesc(__return_storage_ptr__);
  if (glDataType == 0x1404) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_INT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x01';
    __return_storage_ptr__->TypeName = "int";
  }
  else if (glDataType == 0x1405) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_UINT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x01';
    __return_storage_ptr__->TypeName = "uint";
  }
  else if (glDataType == 0x1406) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x01';
    __return_storage_ptr__->TypeName = "float";
  }
  else if (glDataType == 0x140a) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x01';
    __return_storage_ptr__->TypeName = "double";
  }
  else if (glDataType == 0x8b50) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "vec2";
  }
  else if (glDataType == 0x8b51) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "vec3";
  }
  else if (glDataType == 0x8b52) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "vec4";
  }
  else if (glDataType == 0x8b53) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_INT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "ivec2";
  }
  else if (glDataType == 0x8b54) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_INT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "ivec3";
  }
  else if (glDataType == 0x8b55) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_INT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "ivec4";
  }
  else if (glDataType == 0x8b56) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_BOOL;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x01';
    __return_storage_ptr__->TypeName = "bool";
  }
  else if (glDataType == 0x8b57) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_BOOL;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "bvec2";
  }
  else if (glDataType == 0x8b58) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_BOOL;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "bvec3";
  }
  else if (glDataType == 0x8b59) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_BOOL;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "bvec4";
  }
  else if (glDataType == 0x8b5a) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x02';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "mat2x2";
  }
  else if (glDataType == 0x8b5b) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x03';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "mat3x3";
  }
  else if (glDataType == 0x8b5c) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x04';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "mat4x4";
  }
  else if (glDataType == 0x8b65) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x02';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "mat2x3";
  }
  else if (glDataType == 0x8b66) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x02';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "mat2x4";
  }
  else if (glDataType == 0x8b67) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x03';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "mat3x2";
  }
  else if (glDataType == 0x8b68) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x03';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "mat3x4";
  }
  else if (glDataType == 0x8b69) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x04';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "mat4x2";
  }
  else if (glDataType == 0x8b6a) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_FLOAT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x04';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "mat4x3";
  }
  else if (glDataType == 0x8dc6) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_UINT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "uvec2";
  }
  else if (glDataType == 0x8dc7) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_UINT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "uvec3";
  }
  else if (glDataType == 0x8dc8) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_UINT;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "uvec4";
  }
  else if (glDataType == 0x8f46) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x02';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "dmat2";
  }
  else if (glDataType == 0x8f47) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x03';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "dmat3";
  }
  else if (glDataType == 0x8f48) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x04';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "dmat4";
  }
  else if (glDataType == 0x8f49) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x02';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "dmat2x3";
  }
  else if (glDataType == 0x8f4a) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x02';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "dmat2x4";
  }
  else if (glDataType == 0x8f4b) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x03';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "dmat3x2";
  }
  else if (glDataType == 0x8f4c) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x03';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "dmat3x4";
  }
  else if (glDataType == 0x8f4d) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x04';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "dmat4x2";
  }
  else if (glDataType == 0x8f4e) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    __return_storage_ptr__->NumColumns = '\x04';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "dmat4x3";
  }
  else if (glDataType == 0x8ffc) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x02';
    __return_storage_ptr__->TypeName = "dvec2";
  }
  else if (glDataType == 0x8ffd) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x03';
    __return_storage_ptr__->TypeName = "dvec3";
  }
  else if (glDataType == 0x8ffe) {
    __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_DOUBLE;
    __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    __return_storage_ptr__->NumColumns = '\x01';
    __return_storage_ptr__->NumRows = '\x04';
    __return_storage_ptr__->TypeName = "dvec4";
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCodeVariableDesc GLDataTypeToShaderCodeVariableDesc(GLenum glDataType)
{
    ShaderCodeVariableDesc Desc;
    switch (glDataType)
    {
        case GL_FLOAT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "float";
            break;

        case GL_FLOAT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "vec2";
            break;

        case GL_FLOAT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "vec3";
            break;

        case GL_FLOAT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "vec4";
            break;

        case GL_DOUBLE:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "double";
            break;

        case GL_DOUBLE_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dvec2";
            break;

        case GL_DOUBLE_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dvec3";
            break;

        case GL_DOUBLE_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dvec4";
            break;

        case GL_INT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "int";
            break;

        case GL_INT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "ivec2";
            break;

        case GL_INT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "ivec3";
            break;

        case GL_INT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "ivec4";
            break;

        case GL_UNSIGNED_INT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "uint";
            break;

        case GL_UNSIGNED_INT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "uvec2";
            break;

        case GL_UNSIGNED_INT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "uvec3";
            break;

        case GL_UNSIGNED_INT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "uvec4";
            break;

        case GL_BOOL:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "bool";
            break;

        case GL_BOOL_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "bvec2";
            break;

        case GL_BOOL_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "bvec3";
            break;

        case GL_BOOL_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "bvec4";
            break;

        case GL_FLOAT_MAT2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat2x2";
            break;

        case GL_FLOAT_MAT3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat3x3";
            break;

        case GL_FLOAT_MAT4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat4x4";
            break;

        case GL_FLOAT_MAT2x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat2x3";
            break;

        case GL_FLOAT_MAT2x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat2x4";
            break;

        case GL_FLOAT_MAT3x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat3x2";
            break;

        case GL_FLOAT_MAT3x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat3x4";
            break;

        case GL_FLOAT_MAT4x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat4x2";
            break;

        case GL_FLOAT_MAT4x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat4x3";
            break;

        case GL_DOUBLE_MAT2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat2";
            break;

        case GL_DOUBLE_MAT3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat3";
            break;

        case GL_DOUBLE_MAT4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat4";
            break;

        case GL_DOUBLE_MAT2x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat2x3";
            break;

        case GL_DOUBLE_MAT2x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat2x4";
            break;

        case GL_DOUBLE_MAT3x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat3x2";
            break;

        case GL_DOUBLE_MAT3x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat3x4";
            break;

        case GL_DOUBLE_MAT4x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat4x2";
            break;

        case GL_DOUBLE_MAT4x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat4x3";
            break;

        default:
            // Unknown type - skip
            break;
    }

    return Desc;
}